

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tabs.cxx
# Opt level: O3

void __thiscall Fl_Tabs::redraw_tabs(Fl_Tabs *this)

{
  int iVar1;
  int iVar2;
  int Y;
  
  iVar1 = tab_height(this);
  iVar2 = Fl::box_dy((uint)(this->super_Fl_Group).super_Fl_Widget.box_);
  Y = (this->super_Fl_Group).super_Fl_Widget.y_;
  if (iVar1 < 0) {
    iVar2 = iVar2 - iVar1;
    Y = (Y - iVar2) + (this->super_Fl_Group).super_Fl_Widget.h_;
  }
  else {
    iVar2 = iVar2 + iVar1;
  }
  Fl_Widget::damage((Fl_Widget *)this,'\x04',(this->super_Fl_Group).super_Fl_Widget.x_,Y,
                    (this->super_Fl_Group).super_Fl_Widget.w_,iVar2);
  return;
}

Assistant:

void Fl_Tabs::redraw_tabs()
{
  int H = tab_height();
  if (H >= 0) {
    H += Fl::box_dy(box());
    damage(FL_DAMAGE_SCROLL, x(), y(), w(), H);
  } else {
    H = Fl::box_dy(box()) - H;
    damage(FL_DAMAGE_SCROLL, x(), y() + h() - H, w(), H);
  }
}